

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9SatClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  Vec_Str_t *vSop;
  uint local_38;
  int c;
  int fVerbose;
  int fCanon;
  int nBTLimit;
  int nCubeLim;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCanon = 1000;
  fVerbose = 1000000;
  c = 0;
  local_38 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"CLcvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9SatClp(): There is no AIG.\n");
          return 0;
        }
        p = Bmc_CollapseOne(pAbc->pGia,fCanon,fVerbose,c,0,local_38);
        Vec_StrFree(p);
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x4c) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
          goto LAB_002bfb26;
        }
        fVerbose = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (fVerbose < 0) goto LAB_002bfb26;
      }
      else if (iVar1 == 99) {
        c = c ^ 1;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_002bfb26;
        local_38 = local_38 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    fCanon = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < fCanon);
LAB_002bfb26:
  Abc_Print(-2,"usage: &satclp [-CL num] [-cvh]\n");
  Abc_Print(-2,"\t         performs SAT based collapsing\n");
  Abc_Print(-2,"\t-C num : the limit on the SOP size of one output [default = %d]\n",
            (ulong)(uint)fCanon);
  Abc_Print(-2,"\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n",
            (ulong)(uint)fVerbose);
  pcVar2 = "no";
  if (c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-c     : toggles using canonical ISOP computation [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9SatClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Str_t * Bmc_CollapseOne( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int nCubeLim = 1000;
    int nBTLimit = 1000000;
    int fCanon   = 0;
    int fVerbose = 0;
    int c;

    Vec_Str_t * vSop;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLim < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            fCanon ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SatClp(): There is no AIG.\n" );
        return 0;
    }
    vSop = Bmc_CollapseOne( pAbc->pGia, nCubeLim, nBTLimit, fCanon, 0, fVerbose );
    Vec_StrFree( vSop );
    return 0;

usage:
    Abc_Print( -2, "usage: &satclp [-CL num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs SAT based collapsing\n" );
    Abc_Print( -2, "\t-C num : the limit on the SOP size of one output [default = %d]\n", nCubeLim );
    Abc_Print( -2, "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-c     : toggles using canonical ISOP computation [default = %s]\n", fCanon? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}